

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

bool __thiscall SimpleString::endsWith(SimpleString *this,SimpleString *other)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar2 = size(this);
  sVar3 = size(other);
  if (sVar3 == 0) {
    bVar4 = true;
  }
  else if (sVar2 < sVar3) {
    bVar4 = false;
  }
  else {
    iVar1 = StrCmp(this->buffer_ + (sVar2 - sVar3),other->buffer_);
    bVar4 = iVar1 == 0;
  }
  return bVar4;
}

Assistant:

bool SimpleString::endsWith(const SimpleString& other) const
{
    size_t length = size();
    size_t other_length = other.size();

    if (other_length == 0) return true;
    if (length == 0) return false;
    if (length < other_length) return false;

    return StrCmp(getBuffer() + length - other_length, other.getBuffer()) == 0;
}